

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assigner.hpp
# Opt level: O0

void __thiscall
diy::DynamicAssigner::DynamicAssigner
          (DynamicAssigner *this,communicator *comm,int size__,int nblocks__)

{
  int in_ECX;
  int in_EDX;
  communicator *in_RSI;
  communicator *in_RDI;
  int in_stack_ffffffffffffffbc;
  communicator *this_00;
  window<int> *this_01;
  
  Assigner::Assigner((Assigner *)in_RDI,in_EDX,in_ECX);
  (in_RDI->comm_).data = (MPI_Comm)&PTR__DynamicAssigner_0025bdb8;
  this_01 = (window<int> *)&in_RDI->owner_;
  mpi::communicator::communicator((communicator *)this_01,in_RSI);
  *(uint *)&in_RDI[1].owner_ = (in_ECX / in_EDX + 1) - (uint)(in_ECX % in_EDX == 0);
  this_00 = in_RDI + 2;
  mpi::window<int>::window(this_01,in_RDI,(uint)((ulong)this_00 >> 0x20));
  mpi::window<int>::lock_all((window<int> *)this_00,in_stack_ffffffffffffffbc);
  return;
}

Assistant:

DynamicAssigner(const mpi::communicator& comm, int size__, int nblocks__):
                      Assigner(size__, nblocks__),
                      comm_(comm),
                      div_(nblocks__ / size__ + ((nblocks__ % size__) == 0 ? 0 : 1)),   // NB: same size window everywhere means the last rank may allocate extra space
                      rank_map_(comm_, div_)                                            { rank_map_.lock_all(mpi::nocheck); }